

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::fill_t<char>::operator=(fill_t<char> *this,basic_string_view<char> s)

{
  size_t i;
  ulong uVar1;
  format_error *this_00;
  
  if (s.size_ < 5) {
    for (uVar1 = 0; s.size_ != uVar1; uVar1 = uVar1 + 1) {
      this->data_[uVar1] = s.data_[uVar1];
    }
    this->size_ = (uchar)s.size_;
    return;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this_00,"invalid fill");
  __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
}

Assistant:

FMT_CONSTEXPR void operator=(basic_string_view<Char> s) {
    auto size = s.size();
    if (size > max_size) {
      FMT_THROW(format_error("invalid fill"));
      return;
    }
    for (size_t i = 0; i < size; ++i) data_[i] = s[i];
    size_ = static_cast<unsigned char>(size);
  }